

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImGuiWindow *window;
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  bool bVar7;
  ImGuiContext *g;
  
  pIVar3 = GImGui;
  window = GImGui->CurrentWindow;
  window->Accessed = true;
  if ((char)flags < '\0') {
    if (out_hovered != (bool *)0x0) {
      *out_hovered = false;
    }
    if (out_held != (bool *)0x0) {
      *out_held = false;
    }
    if (pIVar3->ActiveId == id) {
      pIVar3->ActiveId = 0;
      pIVar3->ActiveIdIsJustActivated = true;
      pIVar3->ActiveIdAllowOverlap = false;
      pIVar3->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
    return false;
  }
  uVar6 = flags | 2;
  if ((flags & 0x1eU) != 0) {
    uVar6 = flags;
  }
  bVar4 = IsHovered(bb,id,SUB41((uVar6 & 0x20) >> 5,0));
  if (bVar4) {
    pIVar3->HoveredId = id;
    pIVar3->HoveredIdAllowOverlap = false;
    if (((uVar6 >> 9 & 1) != 0) &&
       ((((pIVar3->IO).KeyCtrl != false || ((pIVar3->IO).KeyShift != false)) ||
        ((pIVar3->IO).KeyAlt != false)))) goto LAB_0012ab3d;
    if (((uVar6 & 2) != 0) && ((pIVar3->IO).MouseClicked[0] == true)) {
      pIVar3->ActiveId = id;
      pIVar3->ActiveIdIsJustActivated = true;
      pIVar3->ActiveIdAllowOverlap = false;
      pIVar3->ActiveIdWindow = window;
      FocusWindow(window);
      IVar1.y = (pIVar3->IO).MousePos.y - (bb->Min).y;
      IVar1.x = (pIVar3->IO).MousePos.x - (bb->Min).x;
      pIVar3->ActiveIdClickOffset = IVar1;
    }
    pIVar2 = GImGui;
    if ((((uVar6 & 4) == 0) || ((pIVar3->IO).MouseClicked[0] == false)) &&
       (((uVar6 & 0x10) == 0 || ((pIVar3->IO).MouseDoubleClicked[0] != true)))) {
      bVar7 = false;
    }
    else {
      GImGui->ActiveId = 0;
      pIVar2->ActiveIdIsJustActivated = true;
      pIVar2->ActiveIdAllowOverlap = false;
      pIVar2->ActiveIdWindow = (ImGuiWindow *)0x0;
      FocusWindow(window);
      bVar7 = true;
    }
    pIVar2 = GImGui;
    if (((uVar6 & 8) != 0) && ((pIVar3->IO).MouseReleased[0] == true)) {
      if (((uVar6 & 1) == 0) ||
         ((pIVar3->IO).MouseDownDurationPrev[0] < (pIVar3->IO).KeyRepeatDelay)) {
        bVar7 = true;
      }
      GImGui->ActiveId = 0;
      pIVar2->ActiveIdIsJustActivated = true;
      pIVar2->ActiveIdAllowOverlap = false;
      pIVar2->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
    if (((((uVar6 & 1) != 0) && (pIVar3->ActiveId == id)) &&
        (0.0 < (pIVar3->IO).MouseDownDuration[0])) && (bVar5 = IsMouseClicked(0,true), bVar5)) {
      bVar7 = true;
    }
  }
  else {
LAB_0012ab3d:
    bVar7 = false;
  }
  pIVar2 = GImGui;
  if (pIVar3->ActiveId == id) {
    bVar5 = true;
    if ((pIVar3->IO).MouseDown[0] != false) goto LAB_0012aba6;
    if ((bVar4 && (uVar6 & 2) != 0) &&
       (((uVar6 & 1) == 0 || ((pIVar3->IO).MouseDownDurationPrev[0] < (pIVar3->IO).KeyRepeatDelay)))
       ) {
      bVar7 = true;
    }
    GImGui->ActiveId = 0;
    pIVar2->ActiveIdIsJustActivated = true;
    pIVar2->ActiveIdAllowOverlap = false;
    pIVar2->ActiveIdWindow = (ImGuiWindow *)0x0;
  }
  bVar5 = false;
LAB_0012aba6:
  if ((bVar4 && (uVar6 >> 10 & 1) != 0) &&
     (pIVar3->HoveredIdPreviousFrame != 0 && pIVar3->HoveredIdPreviousFrame != id)) {
    bVar7 = false;
    bVar4 = false;
    bVar5 = false;
  }
  if (out_hovered != (bool *)0x0) {
    *out_hovered = bVar4;
  }
  if (out_held != (bool *)0x0) {
    *out_held = bVar5;
  }
  return bVar7;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    if (flags & ImGuiButtonFlags_Disabled)
    {
        if (out_hovered) *out_hovered = false;
        if (out_held) *out_held = false;
        if (g.ActiveId == id) SetActiveID(0);
        return false;
    }

    if ((flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnRelease | ImGuiButtonFlags_PressedOnDoubleClick)) == 0)
        flags |= ImGuiButtonFlags_PressedOnClickRelease;

    bool pressed = false;
    bool hovered = IsHovered(bb, id, (flags & ImGuiButtonFlags_FlattenChilds) != 0);
    if (hovered)
    {
        SetHoveredID(id);
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            //                        | CLICKING        | HOLDING with ImGuiButtonFlags_Repeat
            // PressedOnClickRelease  |  <on release>*  |  <on repeat> <on repeat> .. (NOT on release)  <-- MOST COMMON! (*) only if both click/release were over bounds
            // PressedOnClick         |  <on click>     |  <on click> <on repeat> <on repeat> ..
            // PressedOnRelease       |  <on release>   |  <on repeat> <on repeat> .. (NOT on release)
            // PressedOnDoubleClick   |  <on dclick>    |  <on dclick> <on repeat> <on repeat> ..
            if ((flags & ImGuiButtonFlags_PressedOnClickRelease) && g.IO.MouseClicked[0])
            {
                SetActiveID(id, window); // Hold on ID
                FocusWindow(window);
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;
            }
            if (((flags & ImGuiButtonFlags_PressedOnClick) && g.IO.MouseClicked[0]) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDoubleClicked[0]))
            {
                pressed = true;
                SetActiveID(0);
                FocusWindow(window);
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && g.IO.MouseReleased[0])
            {
                if (!((flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[0] >= g.IO.KeyRepeatDelay))  // Repeat mode trumps <on release>
                    pressed = true;
                SetActiveID(0);
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above). 
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if ((flags & ImGuiButtonFlags_Repeat) && g.ActiveId == id && g.IO.MouseDownDuration[0] > 0.0f && IsMouseClicked(0, true))
                pressed = true;
        }
    }

    bool held = false;
    if (g.ActiveId == id)
    {
        if (g.IO.MouseDown[0])
        {
            held = true;
        }
        else
        {
            if (hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease))
                if (!((flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[0] >= g.IO.KeyRepeatDelay))  // Repeat mode trumps <on release>
                    pressed = true;
            SetActiveID(0);
        }
    }

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowOverlapMode) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = pressed = held = false;

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}